

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

json * __thiscall argo::json::find(json *this,pointer *p)

{
  type_t tVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  string *__k;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  json_exception *pjVar6;
  exception_type et;
  _List_node_base *p_Var7;
  token t;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_48 [16];
  _List_node_base *local_38;
  
  p_Var2 = (_List_node_base *)pointer::get_path_abi_cxx11_(p);
  p_Var7 = p_Var2->_M_next;
  if (p_Var7 != p_Var2) {
    et = pointer_not_matched_e;
    do {
      local_60._0_4_ = *(undefined4 *)&p_Var7[1]._M_next;
      local_58._M_p = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,p_Var7[1]._M_prev,
                 (long)&(p_Var7[2]._M_next)->_M_next + (long)p_Var7[1]._M_prev);
      local_38 = p_Var7[3]._M_prev;
      tVar1 = pointer::token::get_type((token *)local_60);
      if (tVar1 != all_e) {
        if (tVar1 == object_e) {
          if (this->m_type != object_e) {
            et = pointer_not_matched_e;
            goto LAB_0010ec68;
          }
          __k = pointer::token::get_name_abi_cxx11_((token *)local_60);
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
                  ::find(&(this->m_value).u_object._M_t,__k);
          if (cVar4._M_node == (_Base_ptr)((long)&this->m_value + 8)) {
            pjVar6 = (json_exception *)__cxa_allocate_exception(0xd8);
            json_exception::json_exception(pjVar6,pointer_not_matched_e);
            __cxa_throw(pjVar6,&json_exception::typeinfo,std::exception::~exception);
          }
          p_Var5 = cVar4._M_node + 2;
        }
        else {
          if (tVar1 != array_e) {
            et = pointer_token_type_invalid_e;
LAB_0010ec68:
            pjVar6 = (json_exception *)__cxa_allocate_exception(0xd8);
            json_exception::json_exception(pjVar6,et);
            __cxa_throw(pjVar6,&json_exception::typeinfo,std::exception::~exception);
          }
          if (this->m_type != array_e) goto LAB_0010ec68;
          sVar3 = pointer::token::get_index((token *)local_60);
          if ((ulong)((long)(this->m_value).u_array.
                            super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_value).u_array.
                            super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= sVar3)
          goto LAB_0010ec68;
          sVar3 = pointer::token::get_index((token *)local_60);
          p_Var5 = (_Base_ptr)
                   ((this->m_value).u_array.
                    super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + sVar3);
        }
        this = *(json **)p_Var5;
      }
      if (local_58._M_p != local_48) {
        operator_delete(local_58._M_p);
      }
      p_Var7 = (((_List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_> *)
                &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var7 != p_Var2);
  }
  return this;
}

Assistant:

const json &json::find(const pointer &p) const
{
    const json *res = this;

    for (auto t : p.get_path())
    {
        switch (t.get_type())
        {
        case pointer::token::all_e:
            break;

        case pointer::token::object_e:
            if (res->m_type == object_e)
            {
                auto i = res->m_value.u_object.find(t.get_name());
                if (i == res->m_value.u_object.end())
                {
                    throw json_exception(json_exception::pointer_not_matched_e);
                }
                else
                {
                    res = i->second.get();
                }
            }
            else
            {
                throw json_exception(json_exception::pointer_not_matched_e);
            }
            break;

        case pointer::token::array_e:
            if (res->m_type == array_e)
            {
                if (t.get_index() < res->m_value.u_array.size())
                {
                    res = (res->m_value.u_array)[t.get_index()].get();
                }
                else
                {
                    throw json_exception(json_exception::pointer_not_matched_e);
                }
            }
            else
            {
                throw json_exception(json_exception::pointer_not_matched_e);
            }
            break;

        default:
            throw json_exception(json_exception::pointer_token_type_invalid_e);
        }
    }

    return *res;
}